

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareVertexShaderCode
          (GPUShaderFP64Test10 *this,functionObject *function_object)

{
  uint uVar1;
  uint uVar2;
  GLchar *pGVar3;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  GLuint argument_1;
  GLuint GVar4;
  GPUShaderFP64Test10 *pGVar5;
  char *pcVar6;
  GLuint argument;
  size_t search_position;
  uint local_a0;
  GLuint local_9c;
  string string;
  string uniform_type;
  string result_type;
  
  local_9c = (*function_object->_vptr_functionObject[3])(function_object);
  local_a0 = (*function_object->_vptr_functionObject[5])(function_object);
  uVar1 = (*function_object->_vptr_functionObject[6])(function_object,0);
  Utils::getVariableTypeString_abi_cxx11_(&result_type,(Utils *)(ulong)uVar1,type);
  search_position = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&string,
             "#version 400 core\n\nprecision highp float;\n\nARGUMENT_DEFINITION\nRESULT_DEFINITION\nvoid main()\n{\n    RESULT_NAME = RESULT_TYPE(FUNCTION_NAME(ARGUMENT));\n}\n\n"
             ,(allocator<char> *)&uniform_type);
  for (uVar1 = 0; local_9c != uVar1; uVar1 = uVar1 + 1) {
    pGVar5 = (GPUShaderFP64Test10 *)function_object;
    uVar2 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)uVar1);
    pGVar3 = getUniformName(pGVar5,uVar1);
    Utils::getVariableTypeString_abi_cxx11_(&uniform_type,(Utils *)(ulong)uVar2,type_00);
    Utils::replaceToken("ARGUMENT_DEFINITION",&search_position,
                        "uniform UNIFORM_TYPE UNIFORM_NAME;\nARGUMENT_DEFINITION",&string);
    search_position = search_position - 0x36;
    Utils::replaceToken("UNIFORM_TYPE",&search_position,uniform_type._M_dataplus._M_p,&string);
    Utils::replaceToken("UNIFORM_NAME",&search_position,pGVar3,&string);
    std::__cxx11::string::~string((string *)&uniform_type);
  }
  Utils::replaceToken("ARGUMENT_DEFINITION",&search_position,
                      glcts::fixed_sample_locations_values + 1,&string);
  for (uVar1 = 0; local_a0 != uVar1; uVar1 = uVar1 + 1) {
    pGVar5 = (GPUShaderFP64Test10 *)function_object;
    uVar2 = (*function_object->_vptr_functionObject[6])(function_object,(ulong)uVar1);
    pGVar3 = getVaryingName(pGVar5,uVar1);
    Utils::getVariableTypeString_abi_cxx11_(&uniform_type,(Utils *)(ulong)uVar2,type_01);
    Utils::replaceToken("RESULT_DEFINITION",&search_position,
                        "flat out RESULT_TYPE RESULT_NAME;\nRESULT_DEFINITION",&string);
    search_position = search_position - 0x33;
    Utils::replaceToken("RESULT_TYPE",&search_position,uniform_type._M_dataplus._M_p,&string);
    Utils::replaceToken("RESULT_NAME",&search_position,pGVar3,&string);
    std::__cxx11::string::~string((string *)&uniform_type);
  }
  Utils::replaceToken("RESULT_DEFINITION",&search_position,glcts::fixed_sample_locations_values + 1,
                      &string);
  Utils::replaceToken("RESULT_NAME",&search_position,"result_0",&string);
  Utils::replaceToken("RESULT_TYPE",&search_position,result_type._M_dataplus._M_p,&string);
  pcVar6 = "FUNCTION_NAME";
  Utils::replaceToken("FUNCTION_NAME",&search_position,function_object->m_function_name,&string);
  for (GVar4 = 0; local_9c != GVar4; GVar4 = GVar4 + 1) {
    pGVar3 = getUniformName((GPUShaderFP64Test10 *)pcVar6,GVar4);
    pcVar6 = ", UNIFORM_NAMEARGUMENT";
    if (GVar4 == 0) {
      pcVar6 = "UNIFORM_NAMEARGUMENT";
    }
    Utils::replaceToken("ARGUMENT",&search_position,pcVar6,&string);
    search_position = search_position - 0x14;
    pcVar6 = "UNIFORM_NAME";
    Utils::replaceToken("UNIFORM_NAME",&search_position,pGVar3,&string);
  }
  for (GVar4 = 1; GVar4 < local_a0; GVar4 = GVar4 + 1) {
    pGVar3 = getVaryingName((GPUShaderFP64Test10 *)pcVar6,GVar4);
    Utils::replaceToken("ARGUMENT",&search_position,", UNIFORM_NAMEARGUMENT",&string);
    search_position = search_position - 0x14;
    pcVar6 = "UNIFORM_NAME";
    Utils::replaceToken("UNIFORM_NAME",&search_position,pGVar3,&string);
  }
  Utils::replaceToken("ARGUMENT",&search_position,glcts::fixed_sample_locations_values + 1,&string);
  std::__cxx11::string::_M_assign((string *)&this->m_vertex_shader_code);
  std::__cxx11::string::~string((string *)&string);
  std::__cxx11::string::~string((string *)&result_type);
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareVertexShaderCode(const functionObject& function_object)
{
	static const glw::GLchar* shader_template_code = "#version 400 core\n"
													 "\n"
													 "precision highp float;\n"
													 "\n"
													 "ARGUMENT_DEFINITION"
													 "\n"
													 "RESULT_DEFINITION"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    RESULT_NAME = RESULT_TYPE(FUNCTION_NAME(ARGUMENT));\n"
													 "}\n"
													 "\n";

	static const glw::GLchar* argument_definition_token = "ARGUMENT_DEFINITION";
	static const glw::GLchar* argument_token			= "ARGUMENT";
	static const glw::GLchar* function_name_token		= "FUNCTION_NAME";
	static const glw::GLchar* result_definition_token   = "RESULT_DEFINITION";
	static const glw::GLchar* result_name_token			= "RESULT_NAME";
	static const glw::GLchar* result_type_token			= "RESULT_TYPE";
	static const glw::GLchar* uniform_name_token		= "UNIFORM_NAME";
	static const glw::GLchar* uniform_type_token		= "UNIFORM_TYPE";

	static const glw::GLchar* argument_definition = "uniform UNIFORM_TYPE UNIFORM_NAME;\nARGUMENT_DEFINITION";
	static const glw::GLchar* argument_str		  = ", UNIFORM_NAMEARGUMENT";
	static const glw::GLchar* first_argument	  = "UNIFORM_NAMEARGUMENT";
	static const glw::GLchar* result_definition   = "flat out RESULT_TYPE RESULT_NAME;\nRESULT_DEFINITION";

	const glw::GLuint argument_definition_length = (glw::GLuint)strlen(argument_definition);
	const glw::GLuint first_argument_length		 = (glw::GLuint)strlen(first_argument);
	const glw::GLuint n_arguments				 = function_object.getArgumentCount();
	const glw::GLuint n_results					 = function_object.getResultCount();
	const glw::GLuint result_definition_length   = (glw::GLuint)strlen(result_definition);
	std::string		  result_type				 = Utils::getVariableTypeString(function_object.getResultType(0));

	size_t		search_position = 0;
	std::string string			= shader_template_code;

	/* Replace ARGUMENT_DEFINITION with definitions */
	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		Utils::_variable_type argument_type = function_object.getArgumentType(argument);
		const glw::GLchar*	uniform_name  = getUniformName(argument);
		std::string			  uniform_type  = Utils::getVariableTypeString(argument_type);

		Utils::replaceToken(argument_definition_token, search_position, argument_definition, string);

		search_position -= argument_definition_length;

		Utils::replaceToken(uniform_type_token, search_position, uniform_type.c_str(), string);
		Utils::replaceToken(uniform_name_token, search_position, uniform_name, string);
	}

	/* Remove ARGUMENT_DEFINITION */
	Utils::replaceToken(argument_definition_token, search_position, "", string);

	/* Replace RESULT_DEFINITION with definitions */
	for (glw::GLuint result = 0; result < n_results; ++result)
	{
		Utils::_variable_type variable_type = function_object.getResultType(result);
		const glw::GLchar*	varying_name  = getVaryingName(result);
		std::string			  varying_type  = Utils::getVariableTypeString(variable_type);

		Utils::replaceToken(result_definition_token, search_position, result_definition, string);

		search_position -= result_definition_length;

		Utils::replaceToken(result_type_token, search_position, varying_type.c_str(), string);
		Utils::replaceToken(result_name_token, search_position, varying_name, string);
	}

	/* Remove RESULT_DEFINITION */
	Utils::replaceToken(result_definition_token, search_position, "", string);

	/* Replace RESULT_NAME */
	Utils::replaceToken(result_name_token, search_position, getVaryingName(0), string);

	/* Replace RESULT_TYPE */
	Utils::replaceToken(result_type_token, search_position, result_type.c_str(), string);

	/* Replace FUNCTION_NAME */
	Utils::replaceToken(function_name_token, search_position, function_object.getName(), string);

	/* Replace ARGUMENT with list of arguments */
	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLchar* uniform_name = getUniformName(argument);

		if (0 == argument)
		{
			Utils::replaceToken(argument_token, search_position, first_argument, string);
		}
		else
		{
			Utils::replaceToken(argument_token, search_position, argument_str, string);
		}

		search_position -= first_argument_length;

		Utils::replaceToken(uniform_name_token, search_position, uniform_name, string);
	}

	for (glw::GLuint result = 1; result < n_results; ++result)
	{
		const glw::GLchar* varying_name = getVaryingName(result);

		Utils::replaceToken(argument_token, search_position, argument_str, string);

		search_position -= first_argument_length;

		Utils::replaceToken(uniform_name_token, search_position, varying_name, string);
	}

	/* Remove ARGUMENT */
	Utils::replaceToken(argument_token, search_position, "", string);

	m_vertex_shader_code = string;
}